

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestRedactedMessage::_InternalSerialize
          (TestRedactedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  Any *value;
  ulong uVar2;
  uint8_t *puVar3;
  char *in_R9;
  undefined8 *puVar4;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  string_view field_name_04;
  string_view field_name_05;
  string_view field_name_06;
  string_view field_name_07;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  string_view s_07;
  
  uVar1 = *(uint *)&this->field_0;
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.text_field_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestRedactedMessage.text_field";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x2e,field_name);
    s._M_str = (char *)*puVar4;
    s._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"proto2_unittest.TestRedactedMessage.meta_annotated";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x32,field_name_00);
    s_00._M_str = (char *)*puVar4;
    s_00._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,8,s_00,target);
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"proto2_unittest.TestRedactedMessage.repeated_meta_annotated";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x3b,field_name_01);
    s_01._M_str = (char *)*puVar4;
    s_01._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,9,s_01,target);
  }
  if ((uVar1 & 8) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_02._M_str = in_R9;
    field_name_02._M_len =
         (size_t)"proto2_unittest.TestRedactedMessage.unredacted_repeated_annotations";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x43,field_name_02);
    s_02._M_str = (char *)*puVar4;
    s_02._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,s_02,target);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.unreported_non_meta_debug_redact_field_.tagged_ptr_.ptr_
             & 0xfffffffffffffffc);
    field_name_03._M_str = in_R9;
    field_name_03._M_len =
         (size_t)"proto2_unittest.TestRedactedMessage.unreported_non_meta_debug_redact_field";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x4a,field_name_03);
    s_03._M_str = (char *)*puVar4;
    s_03._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x11,s_03,target);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    value = (this->field_0)._impl_.any_field_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x12,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream)
    ;
  }
  if ((uVar1 & 0x20) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    field_name_04._M_str = in_R9;
    field_name_04._M_len = (size_t)"proto2_unittest.TestRedactedMessage.redactable_false";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x34,field_name_04);
    s_04._M_str = (char *)*puVar4;
    s_04._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x13,s_04,target);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_05._M_str = in_R9;
    field_name_05._M_len = (size_t)"proto2_unittest.TestRedactedMessage.test_direct_message_enum";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x3c,field_name_05);
    s_05._M_str = (char *)*puVar4;
    s_05._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x16,s_05,target);
  }
  if ((char)uVar1 < '\0') {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_06._M_str = in_R9;
    field_name_06._M_len = (size_t)"proto2_unittest.TestRedactedMessage.test_nested_message_enum";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x3c,field_name_06);
    s_06._M_str = (char *)*puVar4;
    s_06._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x17,s_06,target);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_07._M_str = in_R9;
    field_name_07._M_len = (size_t)"proto2_unittest.TestRedactedMessage.test_redacted_message_enum";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x3e,field_name_07);
    s_07._M_str = (char *)*puVar4;
    s_07._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x18,s_07,target);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRedactedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRedactedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRedactedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string text_field = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_text_field();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.text_field");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // string meta_annotated = 8 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_meta_annotated();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.meta_annotated");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  // string repeated_meta_annotated = 9 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_REDACTABLE];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_repeated_meta_annotated();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.repeated_meta_annotated");
    target = stream->WriteStringMaybeAliased(9, _s, target);
  }

  // string unredacted_repeated_annotations = 10 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT_AGAIN];
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_unredacted_repeated_annotations();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.unredacted_repeated_annotations");
    target = stream->WriteStringMaybeAliased(10, _s, target);
  }

  // string unreported_non_meta_debug_redact_field = 17 [debug_redact = true];
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_unreported_non_meta_debug_redact_field();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.unreported_non_meta_debug_redact_field");
    target = stream->WriteStringMaybeAliased(17, _s, target);
  }

  // .google.protobuf.Any any_field = 18 [debug_redact = true];
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.any_field_, this_._impl_.any_field_->GetCachedSize(), target,
        stream);
  }

  // string redactable_false = 19 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE_FALSE];
  if ((cached_has_bits & 0x00000020u) != 0) {
    const ::std::string& _s = this_._internal_redactable_false();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.redactable_false");
    target = stream->WriteStringMaybeAliased(19, _s, target);
  }

  // string test_direct_message_enum = 22 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000040u) != 0) {
    const ::std::string& _s = this_._internal_test_direct_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_direct_message_enum");
    target = stream->WriteStringMaybeAliased(22, _s, target);
  }

  // string test_nested_message_enum = 23 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000080u) != 0) {
    const ::std::string& _s = this_._internal_test_nested_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_nested_message_enum");
    target = stream->WriteStringMaybeAliased(23, _s, target);
  }

  // string test_redacted_message_enum = 24 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000100u) != 0) {
    const ::std::string& _s = this_._internal_test_redacted_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_redacted_message_enum");
    target = stream->WriteStringMaybeAliased(24, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRedactedMessage)
  return target;
}